

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void notch::core::internal::scaleAdd<float*,float*>
               (float alpha,float *x_begin,float *x_end,float *y_begin,float *y_end)

{
  OMP_size_t i;
  long lVar1;
  ostream *poVar2;
  invalid_argument *this;
  long lVar3;
  string asStack_1b8 [32];
  ostringstream what;
  
  lVar3 = (long)x_end - (long)x_begin >> 2;
  if (lVar3 == (long)y_end - (long)y_begin >> 2) {
    for (lVar1 = 0; lVar3 != lVar1; lVar1 = lVar1 + 1) {
      y_begin[lVar1] = x_begin[lVar1] * alpha + y_begin[lVar1];
    }
    return;
  }
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&what);
  poVar2 = ::std::operator<<((ostream *)&what,"stl_scaleAdd: incompatible shapes:\n");
  poVar2 = ::std::operator<<(poVar2," vector X size = ");
  poVar2 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = ::std::operator<<(poVar2," vector Y size = ");
  ::std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::stringbuf::str();
  ::std::invalid_argument::invalid_argument(this,asStack_1b8);
  __cxa_throw(this,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
}

Assistant:

void
INTERNAL_NOBLAS(scaleAdd)(
         float alpha,
         VectorX_Iter x_begin, VectorX_Iter x_end,
         VectorY_OutIter y_begin, VectorY_OutIter y_end) {
    size_t x_size = std::distance(x_begin, x_end);
    size_t y_size = std::distance(y_begin, y_end);
    if (x_size != y_size) {
        std::ostringstream what;
        what << "stl_scaleAdd: incompatible shapes:\n"
            << " vector X size = " << x_size
            << " vector Y size = " << y_size;
        throw std::invalid_argument(what.str());
    }
#ifdef NOTCH_USE_OPENMP
#pragma omp parallel for shared(x_begin, y_begin, x_size, alpha)
#endif
    for (OMP_size_t i = 0; i < x_size; ++i) {
        float x_i = *(x_begin + i);
        float &y_i = *(y_begin + i);
        y_i += alpha * x_i;
    }
}